

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall
stick::String::append<char_const*,stick::String>(String *this,char *param_2,String *param_3)

{
  Size SVar1;
  Size SVar2;
  int unpack2 [3];
  Size off;
  int unpack [3];
  Size len;
  String *_args_local_1;
  char *_args_local;
  String *this_local;
  
  SVar1 = detail::_StringCopier::strLen(param_2);
  SVar2 = detail::_StringCopier::strLen(param_3);
  if (SVar2 + SVar1 != 0) {
    unpack2._4_8_ = this->m_length;
    preAppend(this,this->m_length + SVar2 + SVar1);
    detail::_StringCopier::performCopy(this,(Size *)(unpack2 + 1),param_2);
    detail::_StringCopier::performCopy(this,(Size *)(unpack2 + 1),param_3);
  }
  return;
}

Assistant:

inline void String::append(AppendVariadicFlag _flag, Strings... _args)
{
    Size len = 0;
    int unpack[]{ 0, (len += detail::_StringCopier::strLen(_args), 0)... };
    STICK_UNUSED(unpack);
    if (!len)
        return;
    Size off = m_length;
    preAppend(m_length + len);
    int unpack2[]{ 0, (detail::_StringCopier::performCopy(*this, off, _args))... };
    STICK_UNUSED(unpack2);
}